

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

string * __thiscall
t_javame_generator::function_signature
          (string *__return_storage_ptr__,t_javame_generator *this,t_function *tfunction,
          string *prefix)

{
  bool bVar1;
  string *__rhs;
  t_struct *ptVar2;
  reference pptVar3;
  t_type *ttype_00;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_150
  ;
  t_field **local_148;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_140
  ;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_31;
  t_type *local_30;
  t_type *ttype;
  string *prefix_local;
  t_function *tfunction_local;
  t_javame_generator *this_local;
  string *result;
  
  ttype = (t_type *)prefix;
  prefix_local = (string *)tfunction;
  tfunction_local = (t_function *)this;
  this_local = (t_javame_generator *)__return_storage_ptr__;
  local_30 = t_function::get_returntype(tfunction);
  local_31 = 0;
  type_name_abi_cxx11_(&local_f8,this,local_30,false,false,false);
  std::operator+(&local_d8,&local_f8," ");
  std::operator+(&local_b8,&local_d8,prefix);
  __rhs = t_function::get_name_abi_cxx11_((t_function *)prefix_local);
  std::operator+(&local_98,&local_b8,__rhs);
  std::operator+(&local_78,&local_98,"(");
  ptVar2 = t_function::get_arglist((t_function *)prefix_local);
  argument_list_abi_cxx11_((string *)&xs,this,ptVar2,true);
  std::operator+(&local_58,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xs);
  std::operator+(__return_storage_ptr__,&local_58,") throws ");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&xs);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  ptVar2 = t_function::get_xceptions((t_function *)prefix_local);
  x_iter._M_current = (t_field **)t_struct::get_members(ptVar2);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_140);
  local_148 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
  local_140._M_current = local_148;
  while( true ) {
    local_150._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(x_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_140,&local_150);
    if (!bVar1) break;
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_140);
    ttype_00 = t_field::get_type(*pptVar3);
    type_name_abi_cxx11_(&local_190,this,ttype_00,false,false,false);
    std::operator+(&local_170,&local_190,", ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_140);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"TException");
  return __return_storage_ptr__;
}

Assistant:

string t_javame_generator::function_signature(t_function* tfunction, string prefix) {
  t_type* ttype = tfunction->get_returntype();
  std::string result = type_name(ttype) + " " + prefix + tfunction->get_name() + "("
                       + argument_list(tfunction->get_arglist()) + ") throws ";
  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;
  for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
    result += type_name((*x_iter)->get_type(), false, false) + ", ";
  }
  result += "TException";
  return result;
}